

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResponseBase.h
# Opt level: O2

set<Token,_std::less<Token>,_std::allocator<Token>_> * __thiscall
ResponseBase::extractTokensFromLine
          (set<Token,_std::less<Token>,_std::allocator<Token>_> *__return_storage_ptr__,
          ResponseBase *this,string *line)

{
  _Rb_tree_header *p_Var1;
  string_view find;
  string_view replacement;
  set<Token,_std::less<Token>,_std::allocator<Token>_> header_tokens;
  set<Token,_std::less<Token>,_std::allocator<Token>_> std_tokens;
  
  find._M_str = "\\_";
  find._M_len = 2;
  replacement._M_str = "_";
  replacement._M_len = 1;
  str::replace_all(line,find,replacement);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  extractStdTokensFromLine(&std_tokens,this,line);
  std::_Rb_tree<Token,Token,std::_Identity<Token>,std::less<Token>,std::allocator<Token>>::
  _M_insert_range_unique<std::move_iterator<std::_Rb_tree_const_iterator<Token>>>
            ((_Rb_tree<Token,Token,std::_Identity<Token>,std::less<Token>,std::allocator<Token>> *)
             __return_storage_ptr__,
             (move_iterator<std::_Rb_tree_const_iterator<Token>_>)
             std_tokens._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (move_iterator<std::_Rb_tree_const_iterator<Token>_>)
             &std_tokens._M_t._M_impl.super__Rb_tree_header);
  extractHeaderTokensFromLine(&header_tokens,this,line);
  std::_Rb_tree<Token,Token,std::_Identity<Token>,std::less<Token>,std::allocator<Token>>::
  _M_insert_range_unique<std::move_iterator<std::_Rb_tree_const_iterator<Token>>>
            ((_Rb_tree<Token,Token,std::_Identity<Token>,std::less<Token>,std::allocator<Token>> *)
             __return_storage_ptr__,
             (move_iterator<std::_Rb_tree_const_iterator<Token>_>)
             header_tokens._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (move_iterator<std::_Rb_tree_const_iterator<Token>_>)
             &header_tokens._M_t._M_impl.super__Rb_tree_header);
  std::_Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_>::
  ~_Rb_tree(&header_tokens._M_t);
  std::_Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_>::
  ~_Rb_tree(&std_tokens._M_t);
  return __return_storage_ptr__;
}

Assistant:

std::set<Token> extractTokensFromLine(std::string line) const { // TODO needs some love
        str::replace_all(line, "\\_", "_");

        std::set<Token> tokens;

        std::set<Token> std_tokens = extractStdTokensFromLine(line);
        tokens.insert(std::make_move_iterator(std_tokens.begin()), std::make_move_iterator(std_tokens.end()));

        std::set<Token> header_tokens = extractHeaderTokensFromLine(line);
        tokens.insert(std::make_move_iterator(header_tokens.begin()), std::make_move_iterator(header_tokens.end()));

        return tokens;
    }